

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall Lodtalk::AST::ArgumentList::ArgumentList(ArgumentList *this,Argument *firstArgument)

{
  pointer *pppAVar1;
  pointer ppAVar2;
  Argument *local_18;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__ArgumentList_001640b8;
  (this->arguments).
  super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arguments).
  super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments).
  super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppAVar2 = (this->arguments).
            super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar2 == (pointer)0x0) {
    local_18 = firstArgument;
    std::vector<Lodtalk::AST::Argument*,std::allocator<Lodtalk::AST::Argument*>>::
    _M_realloc_insert<Lodtalk::AST::Argument*const&>
              ((vector<Lodtalk::AST::Argument*,std::allocator<Lodtalk::AST::Argument*>> *)
               &this->arguments,(iterator)0x0,&local_18);
  }
  else {
    *ppAVar2 = firstArgument;
    pppAVar1 = &(this->arguments).
                super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

ArgumentList::ArgumentList(Argument *firstArgument)
{
	arguments.push_back(firstArgument);
}